

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

NodeIterator __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren
          (UArrIntermediateNode *this)

{
  long in_RSI;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:451:23),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Indexing_SubstitutionTree_hpp:452:20),_Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>
  IStack_38;
  
  IStack_38._iter._inner._inn._inner._to = *(int *)(in_RSI + 0x14);
  IStack_38._iter._inner._inn._func.a = (Node *(*) [5])(in_RSI + 0x18);
  IStack_38._iter._inner._inn._inner._next = 0;
  IStack_38._iter._inner._inn._inner._from = 0;
  IStack_38._iter._inner._next.
  super_OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*&>.
  super_OptionBaseRef<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>._elem =
       (OptionBase<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*&>)
       (OptionBaseRef<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>)0x0;
  Lib::
  pvi<Lib::IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<int>,Lib::arrayIter<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*[5],int>(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*(&)[5],int)::_lambda(auto:1)_1_,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*&>,Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren()::_lambda(auto:1&)_1_,false>,Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::variableChildren()::_lambda(Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*&)_1_,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node**>>>
            ((Lib *)this,&IStack_38);
  return (NodeIterator)
         (IteratorCore<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**> *)this;
}

Assistant:

NodeIterator variableChildren()
      {
        return pvi( arrayIter(_nodes, _size)
              .filter([](auto& n) { return n->term().isVar(); })
              .map([](Node *& n) { return &n; }));
      }